

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O2

void __thiscall IsoWriter::allocateMetadata(IsoWriter *this)

{
  int sectorNum;
  void *__s;
  _Rb_tree_node_base *p_Var1;
  runtime_error *this_00;
  uint uVar2;
  void *pvVar3;
  ulong uVar4;
  size_t __n;
  
  sectorNum = allocateEntity(this,this->m_rootDirInfo,2);
  this->m_systemStreamLBN = sectorNum;
  allocateEntity(this,this->m_systemStreamDir,sectorNum);
  uVar2 = this->m_systemStreamLBN + 3;
  __n = (size_t)uVar2;
  if ((int)uVar2 <= this->m_metadataFileLen / 0x800) {
    File::seek(&this->m_file,(long)this->m_metadataFileLen + 0xa0000,smBegin);
    __s = operator_new__(0x10000);
    memset(__s,0,0x10000);
    strcpy((char *)((long)__s + 1),(this->m_impId)._M_dataplus._M_p);
    *(undefined4 *)((long)__s + 0x20) = 0;
    *(uint *)((long)__s + 0x24) =
         (uint)(ushort)(this->m_mappingEntries)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    *(undefined8 *)((long)__s + 0x28) = 0;
    p_Var1 = (this->m_mappingEntries)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    uVar4 = 0x30;
    while ((_Rb_tree_header *)p_Var1 != &(this->m_mappingEntries)._M_t._M_impl.super__Rb_tree_header
          ) {
      *(_Rb_tree_color *)((long)__s + uVar4) = p_Var1[1]._M_color;
      *(undefined4 *)((long)__s + uVar4 + 4) = *(undefined4 *)&p_Var1[1].field_0x4;
      __n = (size_t)*(uint *)&p_Var1[1]._M_parent;
      *(uint *)((long)__s + uVar4 + 8) = *(uint *)&p_Var1[1]._M_parent;
      *(undefined4 *)((long)__s + uVar4 + 0xc) = 0x10001;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
      uVar4 = uVar4 + 0x10;
    }
    pvVar3 = __s;
    FileEntryInfo::write(this->m_metadataMappingFile,(int)__s,(void *)(uVar4 & 0xffffffff),__n);
    FileEntryInfo::close(this->m_metadataMappingFile,(int)pvVar3);
    operator_delete__(__s);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,
             "ISO error: Not enough space in metadata partition. It possible in a split mode if a lot of files. Please provide addition input parameter --extra-iso-space to increate metadata space. Default value for this parameter in split mode: 4"
            );
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void IsoWriter::allocateMetadata()
{
    constexpr int sectorNum = 2;  // reserve sector for file set descriptor and terminating descriptor
    m_systemStreamLBN = allocateEntity(m_rootDirInfo, sectorNum);
    allocateEntity(m_systemStreamDir, m_systemStreamLBN);

    if (m_systemStreamLBN + 3 > m_metadataFileLen / SECTOR_SIZE)
        throw std::runtime_error(
            "ISO error: Not enough space in metadata partition. It possible in a split mode if a lot of files. Please "
            "provide addition input parameter --extra-iso-space to increate metadata space. Default value for this "
            "parameter in split mode: 4");

    // write udf unique id mapping file
    m_file.seek(static_cast<int64_t>(METADATA_START_ADDR) * SECTOR_SIZE + m_metadataFileLen);

    const auto buffer = new uint8_t[ALLOC_BLOCK_SIZE];
    memset(buffer, 0, ALLOC_BLOCK_SIZE);
    ByteFileWriter writer;
    writer.setBuffer(buffer, ALLOC_BLOCK_SIZE);

    writer.writeCharSpecString(m_impId.c_str(), 32);
    writer.writeLE32(0);  // flags
    writer.writeLE32(static_cast<uint16_t>(m_mappingEntries.size()));
    writer.writeLE32(0);  // reserved
    writer.writeLE32(0);  // reserved

    for (const auto &mappingEntry : m_mappingEntries)
    {
        writer.writeLE32(mappingEntry.first);  // unique ID
        writer.writeLE32(mappingEntry.second.parentLBN);
        writer.writeLE32(mappingEntry.second.LBN);
        writer.writeLE16(1);  // parent partition
        writer.writeLE16(1);  // object partition
    }

    m_metadataMappingFile->write(buffer, static_cast<int32_t>(writer.size()));
    m_metadataMappingFile->close();
    delete[] buffer;
}